

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  undefined1 auVar1 [16];
  Segment *pSVar2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  Cues *pCVar8;
  long lVar9;
  Cluster *pCluster;
  Cluster **ppCVar10;
  long lVar11;
  Cluster **ppCVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Cluster **ppCVar16;
  longlong avail;
  Segment *local_70;
  long local_68;
  longlong total;
  Cluster **local_58;
  ulong local_50;
  Cluster **local_48;
  long len_;
  longlong pos_;
  
  iVar4 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&total,&avail);
  if (iVar4 < 0) {
    return (long)iVar4;
  }
  local_58 = pResult;
  if ((-1 < total) && (total < avail)) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xb21,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  uVar15 = this->m_start + this->m_size;
  if (this->m_size < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  lVar5 = *pos;
  local_70 = this;
  while( true ) {
    while( true ) {
      do {
        if ((-1 < total && total <= lVar5) || (-1 < (long)uVar15 && (long)uVar15 <= lVar5)) {
          return 1;
        }
        if (avail <= lVar5) {
          *len = 1;
          return -3;
        }
        lVar5 = GetUIntLength(this->m_pReader,lVar5,len);
        if (lVar5 < 0) {
          return lVar5;
        }
        if (lVar5 != 0) {
          return -3;
        }
        local_68 = *pos;
        if (-1 < (long)uVar15 && (long)uVar15 < *len + local_68) {
          return -2;
        }
        if (avail < *len + local_68) {
          return -3;
        }
        lVar9 = this->m_start;
        lVar6 = ReadID(this->m_pReader,local_68,len);
        if (lVar6 < 0) {
          return lVar6;
        }
        if (lVar6 == 0) {
          return -1;
        }
        lVar13 = *pos + *len;
        *pos = lVar13;
        if (avail <= lVar13) {
          *len = 1;
          return -3;
        }
        lVar5 = GetUIntLength(this->m_pReader,lVar13,len);
        if (lVar5 < 0) {
          return lVar5;
        }
        if (lVar5 != 0) {
          return -3;
        }
        lVar13 = *len + *pos;
        if (-1 < (long)uVar15 && (long)uVar15 < lVar13) {
          return -2;
        }
        if (avail < lVar13) {
          return -3;
        }
        uVar7 = ReadUInt(this->m_pReader,*pos,len);
        pSVar2 = local_70;
        if ((long)uVar7 < 0) {
          return uVar7;
        }
        lVar13 = *len;
        lVar11 = *pos + lVar13;
        *pos = lVar11;
        lVar5 = lVar11;
      } while (uVar7 == 0);
      uVar14 = -1L << ((char)lVar13 * '\a' & 0x3fU) ^ uVar7;
      lVar5 = uVar7 + lVar11;
      if (((-1 < (long)uVar15) && (uVar14 != 0xffffffffffffffff)) && ((long)uVar15 < lVar5)) {
        return -2;
      }
      this = pSVar2;
      if (lVar6 != 0x1c53bb6b) break;
      if (uVar14 == 0xffffffffffffffff) {
        return -2;
      }
      if (-1 < (long)uVar15 && (long)uVar15 < lVar5) {
        return -2;
      }
      if (local_70->m_pCues == (Cues *)0x0) {
        pCVar8 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
        if (pCVar8 == (Cues *)0x0) {
          pSVar2->m_pCues = (Cues *)0x0;
          return 0;
        }
        pCVar8->m_pSegment = pSVar2;
        pCVar8->m_start = lVar11;
        pCVar8->m_size = uVar7;
        pCVar8->m_element_start = local_68;
        pCVar8->m_element_size = lVar5 - local_68;
        pCVar8->m_preload_count = 0;
        pCVar8->m_cue_points = (CuePoint **)0x0;
        pCVar8->m_count = 0;
        pCVar8->m_pos = lVar11;
        pSVar2->m_pCues = pCVar8;
      }
      *pos = lVar5;
    }
    if (lVar6 == 0x1f43b675) break;
    if (uVar14 == 0xffffffffffffffff) {
      return -2;
    }
    *pos = lVar5;
    if ((-1 < (long)uVar15) && ((long)uVar15 < lVar5)) {
      return -2;
    }
  }
  lVar13 = local_68 - lVar9;
  if (lVar13 == 0 || local_68 < lVar9) {
    local_68 = lVar13;
    __assert_fail("off_next > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xba9,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  local_50 = uVar15 >> 0x3f;
  ppCVar12 = local_70->m_clusters + local_70->m_clusterCount;
  local_48 = ppCVar12 + local_70->m_clusterPreloadCount;
  ppCVar16 = local_48;
  local_68 = lVar13;
  do {
    while( true ) {
      if (ppCVar16 <= ppCVar12) {
        if (ppCVar12 != ppCVar16) {
          __assert_fail("i == j",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbd1,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        lVar9 = Cluster::HasBlockEntries(local_70,local_68,&pos_,&len_);
        pSVar2 = local_70;
        if (lVar9 < 0) {
          *pos = pos_;
          *len = len_;
          return lVar9;
        }
        if (lVar9 == 0) {
          lVar9 = *pos;
          lVar13 = lVar9;
          if (uVar14 != 0xffffffffffffffff) goto LAB_00127df5;
          goto LAB_00127e4e;
        }
        pCluster = Cluster::Create(local_70,-1,local_68);
        if (pCluster == (Cluster *)0x0) {
          return -1;
        }
        lVar13 = (long)ppCVar16 - (long)pSVar2->m_clusters;
        lVar9 = lVar13 >> 3;
        bVar3 = PreloadCluster(pSVar2,pCluster,lVar9);
        if (!bVar3) {
          Cluster::~Cluster(pCluster);
          operator_delete(pCluster);
          return -1;
        }
        if (pSVar2->m_clusters == (Cluster **)0x0) {
          __assert_fail("m_clusters",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbec,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        if (pSVar2->m_clusterSize <= lVar9) {
          __assert_fail("idx_next < m_clusterSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbed,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        if (*(Cluster **)((long)pSVar2->m_clusters + lVar13) != pCluster) {
          __assert_fail("m_clusters[idx_next] == pNext",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbee,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        goto LAB_00127dbd;
      }
      auVar1._8_8_ = (long)ppCVar16 - (long)ppCVar12 >> 0x3f;
      auVar1._0_8_ = (long)ppCVar16 - (long)ppCVar12 >> 3;
      ppCVar10 = ppCVar12 + SUB168(auVar1 / SEXT816(2),0);
      if (local_48 <= ppCVar10) {
        __assert_fail("k < jj",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbbe,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      pCluster = *ppCVar10;
      if (pCluster == (Cluster *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbc1,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      if (-1 < pCluster->m_index) {
        __assert_fail("pNext->m_index < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xbc2,
                      "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)")
        ;
      }
      lVar5 = Cluster::GetPosition(pCluster);
      *pos = lVar5;
      if (local_68 <= lVar5) break;
      ppCVar12 = ppCVar10 + 1;
    }
    ppCVar16 = ppCVar10;
  } while (local_68 < lVar5);
LAB_00127dbd:
  *local_58 = pCluster;
  return 0;
LAB_00127e4e:
  if ((total <= lVar13 && -1 < total) || ((long)uVar15 <= lVar13 && (char)local_50 == '\0')) {
LAB_00127fdc:
    uVar7 = *pos - lVar9;
    if ((long)uVar7 < 0) {
      __assert_fail("cluster_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc53,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
LAB_00127df5:
    *pos = lVar9 + uVar7;
    return (ulong)((long)(lVar9 + uVar7) <= (long)uVar15 || (long)uVar15 < 0) * 4 + -2;
  }
  if (avail <= lVar13) {
    *len = 1;
    return -3;
  }
  lVar5 = GetUIntLength(pSVar2->m_pReader,lVar13,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 != 0) {
    return -3;
  }
  lVar13 = *len + *pos;
  if (-1 < (long)uVar15 && (long)uVar15 < lVar13) {
    return -2;
  }
  if (avail < lVar13) {
    return -3;
  }
  lVar5 = ReadID(pSVar2->m_pReader,*pos,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if ((lVar5 == 0x1c53bb6b) || (lVar5 == 0x1f43b675)) goto LAB_00127fdc;
  lVar13 = *pos + *len;
  *pos = lVar13;
  if (avail <= lVar13) {
    *len = 1;
    return -3;
  }
  lVar5 = GetUIntLength(pSVar2->m_pReader,lVar13,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 != 0) {
    return -3;
  }
  lVar13 = *len + *pos;
  if (-1 < (long)uVar15 && (long)uVar15 < lVar13) {
    return -2;
  }
  if (avail < lVar13) {
    return -3;
  }
  uVar7 = ReadUInt(pSVar2->m_pReader,*pos,len);
  if ((long)uVar7 < 0) {
    return uVar7;
  }
  lVar11 = *len;
  lVar13 = *pos + lVar11;
  *pos = lVar13;
  if (uVar7 != 0) {
    if ((-1L << ((char)lVar11 * '\a' & 0x3fU) ^ uVar7) == 0xffffffffffffffff) {
      return -2;
    }
    lVar13 = lVar13 + uVar7;
    if ((-1 < (long)uVar15) && ((long)uVar15 < lVar13)) {
      return -2;
    }
    *pos = lVar13;
  }
  goto LAB_00127e4e;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}